

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::sprintf_format<double>(double value,buffer *buf,core_format_specs spec)

{
  bool bVar1;
  type tVar2;
  char *size;
  basic_buffer<char> *pbVar3;
  char *pcVar4;
  char *pcVar5;
  core_format_specs in_RSI;
  basic_buffer<char> *in_RDI;
  uint n;
  int result;
  size_t buffer_size;
  char *start;
  char *format_ptr;
  char format [10];
  basic_buffer<char> *in_stack_ffffffffffffffa8;
  basic_buffer<char> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char local_21 [9];
  basic_buffer<char> *local_18;
  core_format_specs local_8;
  
  pcVar5 = local_21;
  local_18 = in_RDI;
  local_8 = in_RSI;
  bVar1 = core_format_specs::has(&local_8,8);
  if (bVar1) {
    pcVar4 = pcVar5 + 1;
    *pcVar5 = '#';
    pcVar5 = pcVar4;
  }
  if (-1 < local_8.precision) {
    pcVar4 = pcVar5 + 1;
    *pcVar5 = '.';
    pcVar5 = pcVar5 + 2;
    *pcVar4 = '*';
  }
  pcVar4 = pcVar5 + 1;
  *pcVar5 = local_8.type;
  *pcVar4 = '\0';
  while( true ) {
    while( true ) {
      pcVar5 = (char *)basic_buffer<char>::capacity(local_18);
      size = basic_buffer<char>::operator[](local_18,0);
      in_stack_ffffffffffffffbc =
           char_traits<char>::format_float<double>
                     (pcVar4,(size_t)size,pcVar5,in_stack_ffffffffffffffbc,
                      (double)in_stack_ffffffffffffffb0);
      if (-1 < in_stack_ffffffffffffffbc) break;
      in_stack_ffffffffffffffa8 = local_18;
      basic_buffer<char>::capacity(local_18);
      basic_buffer<char>::reserve(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    }
    tVar2 = to_unsigned<int>(in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffb0 = (basic_buffer<char> *)(ulong)tVar2;
    pbVar3 = (basic_buffer<char> *)basic_buffer<char>::capacity(local_18);
    if (in_stack_ffffffffffffffb0 < pbVar3) break;
    basic_buffer<char>::reserve(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  }
  basic_buffer<char>::resize(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}